

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleIndexVertexArray.cpp
# Opt level: O1

void __thiscall
cbtTriangleIndexVertexArray::getLockedReadOnlyVertexIndexBase
          (cbtTriangleIndexVertexArray *this,uchar **vertexbase,int *numverts,PHY_ScalarType *type,
          int *vertexStride,uchar **indexbase,int *indexstride,int *numfaces,
          PHY_ScalarType *indicestype,int subpart)

{
  cbtIndexedMesh *pcVar1;
  long lVar2;
  
  lVar2 = (long)subpart;
  pcVar1 = (this->m_indexedMeshes).m_data;
  *numverts = pcVar1[lVar2].m_numVertices;
  *vertexbase = pcVar1[lVar2].m_vertexBase;
  *type = pcVar1[lVar2].m_vertexType;
  *vertexStride = pcVar1[lVar2].m_vertexStride;
  *numfaces = pcVar1[lVar2].m_numTriangles;
  *indexbase = pcVar1[lVar2].m_triangleIndexBase;
  *indexstride = pcVar1[lVar2].m_triangleIndexStride;
  *indicestype = pcVar1[lVar2].m_indexType;
  return;
}

Assistant:

void cbtTriangleIndexVertexArray::getLockedReadOnlyVertexIndexBase(const unsigned char** vertexbase, int& numverts, PHY_ScalarType& type, int& vertexStride, const unsigned char** indexbase, int& indexstride, int& numfaces, PHY_ScalarType& indicestype, int subpart) const
{
	const cbtIndexedMesh& mesh = m_indexedMeshes[subpart];

	numverts = mesh.m_numVertices;
	(*vertexbase) = (const unsigned char*)mesh.m_vertexBase;

	type = mesh.m_vertexType;

	vertexStride = mesh.m_vertexStride;

	numfaces = mesh.m_numTriangles;
	(*indexbase) = (const unsigned char*)mesh.m_triangleIndexBase;
	indexstride = mesh.m_triangleIndexStride;
	indicestype = mesh.m_indexType;
}